

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkineseNAT.cpp
# Opt level: O2

bool __thiscall
tonk::gateway::HTTPRequester::OnTick_IsDisposable(HTTPRequester *this,uint64_t nowUsec)

{
  ErrorResult *this_00;
  bool bVar1;
  allocator local_49;
  Result result;
  string local_40;
  
  bVar1 = (bool)(this->AsyncRefs < 1 & this->Done);
  if ((bVar1 == false) && (14999999 < nowUsec - this->StartUsec)) {
    std::__cxx11::string::string((string *)&local_40,"Connection timeout",&local_49);
    this_00 = (ErrorResult *)operator_new(0x38);
    ErrorResult::ErrorResult(this_00,&local_40);
    result.Error = this_00;
    std::__cxx11::string::~string((string *)&local_40);
    OnDone(this,&result,0,(char *)0x0,0);
    Result::~Result(&result);
  }
  return bVar1;
}

Assistant:

bool HTTPRequester::OnTick_IsDisposable(uint64_t nowUsec)
{
    // If requester is done and no reference remain:
    if (Done && AsyncRefs <= 0) {
        // It can be deleted now
        return true;
    }

    // Check if timeout has elapsed
    const uint64_t deltaUsec = nowUsec - StartUsec;
    if (deltaUsec >= kTimeoutUsec) {
        Result result("Connection timeout");
        OnDone(result);
    }

    // Check again on the next tick
    return false;
}